

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

string * __thiscall
FunctionPointerType::defToString_abi_cxx11_
          (string *__return_storage_ptr__,FunctionPointerType *this)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->typeEnd)._M_string_length == 0) {
    std::operator+(&local_38,"typedef ",&this->type);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_38);
    local_78 = &local_68;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_68 = *plVar2;
      lStack_60 = puVar3[3];
    }
    else {
      local_68 = *plVar2;
      local_78 = (long *)*puVar3;
    }
    local_70 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)(this->name)._M_dataplus._M_p);
    local_58 = &local_48;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_48 = *plVar4;
      lStack_40 = plVar2[3];
    }
    else {
      local_48 = *plVar4;
      local_58 = (long *)*plVar2;
    }
    local_50 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  }
  else {
    std::operator+(&local_38,"typedef ",&this->type);
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_38,(ulong)(this->name)._M_dataplus._M_p);
    local_78 = &local_68;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_68 = *plVar4;
      lStack_60 = plVar2[3];
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)(this->typeEnd)._M_dataplus._M_p);
    local_58 = &local_48;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_48 = *plVar4;
      lStack_40 = plVar2[3];
    }
    else {
      local_48 = *plVar4;
      local_58 = (long *)*plVar2;
    }
    local_50 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionPointerType::defToString() const {
    if (typeEnd.empty()) {
        return "typedef " + type + " " + name + ";";
    }

    return "typedef " + type + name + typeEnd + ";";
}